

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  cmValue cVar4;
  char *__s;
  cmAlphaNum local_d0;
  string shared_link_type_flag_var;
  string static_link_type_flag_var;
  cmAlphaNum local_60;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS",(allocator<char> *)&local_60);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&local_d0);
  this->ArchivesMayBeShared = bVar1;
  std::__cxx11::string::~string((string *)&local_d0);
  this->LinkTypeEnabled = false;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    __s = "EXE";
  }
  else if (TVar2 == SHARED_LIBRARY) {
    __s = "SHARED_LIBRARY";
  }
  else {
    if (TVar2 != MODULE_LIBRARY) goto LAB_003797d0;
    __s = "SHARED_MODULE";
  }
  local_d0.View_._M_len = (size_t)&DAT_00000006;
  local_d0.View_._M_str = "CMAKE_";
  local_60.View_._M_len = strlen(__s);
  local_60.View_._M_str = __s;
  cmStrCat<char[14],std::__cxx11::string,char[7]>
            (&static_link_type_flag_var,&local_d0,&local_60,(char (*) [14])"_LINK_STATIC_",
             &this->LinkLanguage,(char (*) [7])0x6092ff);
  cVar3 = cmMakefile::GetDefinition(this->Makefile,&static_link_type_flag_var);
  local_d0.View_._M_len = (size_t)&DAT_00000006;
  local_d0.View_._M_str = "CMAKE_";
  local_60.View_._M_len = strlen(__s);
  local_60.View_._M_str = __s;
  cmStrCat<char[15],std::__cxx11::string,char[7]>
            (&shared_link_type_flag_var,&local_d0,&local_60,(char (*) [15])"_LINK_DYNAMIC_",
             &this->LinkLanguage,(char (*) [7])0x6092ff);
  cVar4 = cmMakefile::GetDefinition(this->Makefile,&shared_link_type_flag_var);
  std::__cxx11::string::~string((string *)&shared_link_type_flag_var);
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  if (((cVar3.Value != (string *)0x0) &&
      (cVar4.Value != (string *)0x0 && (cVar3.Value)->_M_string_length != 0)) &&
     ((cVar4.Value)->_M_string_length != 0)) {
    this->LinkTypeEnabled = true;
    std::__cxx11::string::_M_assign((string *)&this->StaticLinkTypeFlag);
    std::__cxx11::string::_M_assign((string *)&this->SharedLinkTypeFlag);
  }
LAB_003797d0:
  this_01 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"LINK_SEARCH_START_STATIC",(allocator<char> *)&local_60);
  cmGeneratorTarget::GetProperty(this_01,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = cmIsOn((cmValue)0x37980f);
  this->StartLinkType = LinkShared - bVar1;
  this->CurrentLinkType = LinkShared - bVar1;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  cmValue static_link_type_flag = nullptr;
  cmValue shared_link_type_flag = nullptr;
  const char* target_type_str = nullptr;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_STATIC_", this->LinkLanguage,
               "_FLAGS");
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_DYNAMIC_", this->LinkLanguage,
               "_FLAGS");
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (cmNonempty(static_link_type_flag) && cmNonempty(shared_link_type_flag)) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = *static_link_type_flag;
    this->SharedLinkTypeFlag = *shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmIsOn(lss) ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}